

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
VectorFormatter<DefaultFormatter>::Ser<AutoFile,std::vector<CTxUndo,std::allocator<CTxUndo>>>
          (VectorFormatter<DefaultFormatter> *this,AutoFile *s,
          vector<CTxUndo,_std::allocator<CTxUndo>_> *v)

{
  long lVar1;
  bool bVar2;
  vector<CTxUndo,_std::allocator<CTxUndo>_> *in_RSI;
  long in_FS_OFFSET;
  value_type *elem;
  vector<CTxUndo,_std::allocator<CTxUndo>_> *__range2;
  DefaultFormatter formatter;
  const_iterator __end0;
  const_iterator __begin0;
  AutoFile *in_stack_ffffffffffffffa8;
  AutoFile *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::size
            ((vector<CTxUndo,_std::allocator<CTxUndo>_> *)in_stack_ffffffffffffffa8);
  WriteCompactSize<AutoFile>(in_stack_ffffffffffffffb8,(uint64_t)in_RSI);
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::begin(in_RSI);
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::end(in_RSI);
  while( true ) {
    bVar2 = __gnu_cxx::operator==<const_CTxUndo_*,_std::vector<CTxUndo,_std::allocator<CTxUndo>_>_>
                      ((__normal_iterator<const_CTxUndo_*,_std::vector<CTxUndo,_std::allocator<CTxUndo>_>_>
                        *)in_stack_ffffffffffffffb8,
                       (__normal_iterator<const_CTxUndo_*,_std::vector<CTxUndo,_std::allocator<CTxUndo>_>_>
                        *)in_RSI);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffb8 =
         (AutoFile *)
         __gnu_cxx::
         __normal_iterator<const_CTxUndo_*,_std::vector<CTxUndo,_std::allocator<CTxUndo>_>_>::
         operator*((__normal_iterator<const_CTxUndo_*,_std::vector<CTxUndo,_std::allocator<CTxUndo>_>_>
                    *)in_stack_ffffffffffffffa8);
    DefaultFormatter::Ser<AutoFile,CTxUndo>(in_stack_ffffffffffffffa8,(CTxUndo *)0x111d043);
    __gnu_cxx::__normal_iterator<const_CTxUndo_*,_std::vector<CTxUndo,_std::allocator<CTxUndo>_>_>::
    operator++((__normal_iterator<const_CTxUndo_*,_std::vector<CTxUndo,_std::allocator<CTxUndo>_>_>
                *)in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }